

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O0

Edge * __thiscall State::AddEdge(State *this,Rule *rule)

{
  Edge *this_00;
  size_type sVar1;
  Edge *local_20;
  Edge *edge;
  Rule *rule_local;
  State *this_local;
  
  edge = (Edge *)rule;
  rule_local = (Rule *)this;
  this_00 = (Edge *)operator_new(0x88);
  Edge::Edge(this_00);
  this_00->rule_ = (Rule *)edge;
  this_00->pool_ = &kDefaultPool;
  this_00->env_ = &this->bindings_;
  local_20 = this_00;
  sVar1 = std::vector<Edge_*,_std::allocator<Edge_*>_>::size(&this->edges_);
  local_20->id_ = sVar1;
  std::vector<Edge_*,_std::allocator<Edge_*>_>::push_back(&this->edges_,&local_20);
  return local_20;
}

Assistant:

Edge* State::AddEdge(const Rule* rule) {
  Edge* edge = new Edge();
  edge->rule_ = rule;
  edge->pool_ = &State::kDefaultPool;
  edge->env_ = &bindings_;
  edge->id_ = edges_.size();
  edges_.push_back(edge);
  return edge;
}